

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add.cpp
# Opt level: O3

bool duckdb::TryDecimalAdd::Operation<short,short,short>(int16_t left,int16_t right,int16_t *result)

{
  undefined2 in_register_00000032;
  int iVar1;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,left);
  if (right < 0) {
    if (-9999 - CONCAT22(in_register_00000032,right) <= iVar1) goto LAB_0093bb9c;
  }
  else if (iVar1 <= 9999 - CONCAT22(in_register_00000032,right)) {
LAB_0093bb9c:
    *result = left + right;
    return true;
  }
  return false;
}

Assistant:

bool TryDecimalAddTemplated(T left, T right, T &result) {
	if (right < 0) {
		if (min - right > left) {
			return false;
		}
	} else {
		if (max - right < left) {
			return false;
		}
	}
	result = left + right;
	return true;
}